

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_readPDOmapCA(ecx_contextt *context,uint16 Slave,int *Osize,int *Isize)

{
  uint32 *puVar1;
  uint8 uVar2;
  ec_SMcommtypet *p;
  byte bVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  byte bVar7;
  uint8 uVar8;
  ulong uVar9;
  long lVar10;
  char cVar11;
  char cVar12;
  int rdl;
  
  *Isize = 0;
  *Osize = 0;
  rdl = 10;
  p = context->SMcommtype;
  p->n = '\0';
  iVar4 = ecx_SDOread(context,Slave,0x1c00,'\0','\x01',&rdl,p,700000);
  if ((0 < iVar4) && (bVar7 = context->SMcommtype->n, 2 < bVar7)) {
    bVar7 = bVar7 - 1;
    bVar3 = bVar7;
    if (8 < bVar7) {
      ecx_packeterror(context,Slave,0,'\0',10);
      bVar3 = 8;
    }
    if (1 < bVar3) {
      uVar9 = 8;
      if ((ulong)bVar7 < 8) {
        uVar9 = (ulong)bVar7;
      }
      lVar10 = 0;
      cVar11 = '\0';
      do {
        uVar2 = context->SMcommtype->SMtype[lVar10 + 2];
        cVar12 = cVar11;
        if (uVar2 == '\x02') {
          cVar12 = '\x01';
        }
        if (lVar10 != 0) {
          cVar12 = cVar11;
        }
        uVar8 = cVar12 + uVar2;
        if (uVar2 == '\0') {
          uVar8 = '\0';
        }
        context->slavelist[Slave].SMtype[lVar10 + 2] = uVar8;
        if (uVar8 == '\0') {
          puVar1 = &context->slavelist[Slave].SM[lVar10 + 2].SMflags;
          *puVar1 = *puVar1 & 0xfffeffff;
        }
        if ((byte)(uVar8 - 3) < 2) {
          iVar4 = ecx_readPDOassignCA(context,Slave,(short)lVar10 + 0x1c12);
          if (iVar4 != 0) {
            uVar6 = iVar4 + 0xe;
            if (-1 < (int)(iVar4 + 7U)) {
              uVar6 = iVar4 + 7U;
            }
            context->slavelist[Slave].SM[lVar10 + 2].SMlength = (uint16)(uVar6 >> 3);
            piVar5 = Osize;
            if (uVar8 != '\x03') {
              piVar5 = Isize;
            }
            *piVar5 = *piVar5 + iVar4;
          }
        }
        lVar10 = lVar10 + 1;
        cVar11 = cVar12;
      } while (uVar9 - 1 != lVar10);
    }
  }
  if ((*Isize < 1) && (*Osize < 1)) {
    iVar4 = 0;
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int ecx_readPDOmapCA(ecx_contextt *context, uint16 Slave, int *Osize, int *Isize)
{
   int wkc, rdl;
   int retVal = 0;
   uint8 nSM, iSM, tSM;
   int Tsize;
   uint8 SMt_bug_add;
   
   *Isize = 0;
   *Osize = 0;
   SMt_bug_add = 0;
   rdl = sizeof(ec_SMcommtypet); 
   context->SMcommtype->n = 0;
   /* read SyncManager Communication Type object count Complete Access*/
   wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, 0x00, TRUE, &rdl, context->SMcommtype, EC_TIMEOUTRXM);
   /* positive result from slave ? */
   if ((wkc > 0) && (context->SMcommtype->n > 2))
   {
      /* make nSM equal to number of defined SM */
      nSM = context->SMcommtype->n - 1;
      /* limit to maximum number of SM defined, if true the slave can't be configured */
      if (nSM > EC_MAXSM)
      {
         nSM = EC_MAXSM;
         ecx_packeterror(context, Slave, 0, 0, 10); /* #SM larger than EC_MAXSM */         
      }
      /* iterate for every SM type defined */
      for (iSM = 2 ; iSM <= nSM ; iSM++)
      {
          tSM = context->SMcommtype->SMtype[iSM];

// start slave bug prevention code, remove if possible            
         if((iSM == 2) && (tSM == 2)) // SM2 has type 2 == mailbox out, this is a bug in the slave!
         {
            SMt_bug_add = 1; // try to correct, this works if the types are 0 1 2 3 and should be 1 2 3 4
         }
         if(tSM)
         {
            tSM += SMt_bug_add; // only add if SMt > 0
         }
// end slave bug prevention code
         
         context->slavelist[Slave].SMtype[iSM] = tSM;
         /* check if SM is unused -> clear enable flag */
         if (tSM == 0)
         {
            context->slavelist[Slave].SM[iSM].SMflags =
               htoel( etohl(context->slavelist[Slave].SM[iSM].SMflags) & EC_SMENABLEMASK);
         }
         if ((tSM == 3) || (tSM == 4))
         {
            /* read the assign PDO */
            Tsize = ecx_readPDOassignCA(context, Slave, ECT_SDO_PDOASSIGN + iSM );
            /* if a mapping is found */
            if (Tsize)
            {
               context->slavelist[Slave].SM[iSM].SMlength = htoes((Tsize + 7) / 8);
               if (tSM == 3)
               {
                  /* we are doing outputs */
                  *Osize += Tsize;
               }
               else
               {
                  /* we are doing inputs */
                  *Isize += Tsize;
               }
            }   
         }   
      }
   }

   /* found some I/O bits ? */
   if ((*Isize > 0) || (*Osize > 0))
   {
      retVal = 1;
   }
   return retVal;
}